

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_checkingOwningModelBothUnits_Test::TestBody(Units_checkingOwningModelBothUnits_Test *this)

{
  element_type *peVar1;
  char *pcVar2;
  allocator<char> local_aa;
  allocator<char> local_a9;
  AssertionResult gtest_ar;
  allocator<char> local_81;
  double local_80 [4];
  UnitsPtr u2;
  double local_50 [4];
  UnitsPtr u1;
  ModelPtr model;
  
  libcellml::Model::create();
  libcellml::Units::create();
  peVar1 = u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"u1",(allocator<char> *)local_80);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  peVar1 = u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar,"u",(allocator<char> *)&u2)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_80,"milli",&local_a9);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"",&local_aa);
  libcellml::Units::addUnit((string *)peVar1,(string *)&gtest_ar,2.0,1000.0,(string *)local_80);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"dimensionless",(allocator<char> *)local_80);
  libcellml::Units::addUnit
            ((string *)u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::Units::create();
  peVar1 = u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"u2",(allocator<char> *)local_80);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  peVar1 = u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar,"u",&local_a9);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_80,"kilo",&local_aa);
  pcVar2 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"",&local_81);
  libcellml::Units::addUnit((string *)peVar1,(string *)&gtest_ar,2.0,0.001,(string *)local_80);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"dimensionless",(allocator<char> *)local_80);
  libcellml::Units::addUnit
            ((string *)u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_80[0] = 0.0;
  local_50[0] = (double)libcellml::Units::scalingFactor((shared_ptr *)&u1,(shared_ptr *)&u2,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"0.0","libcellml::Units::scalingFactor(u1, u2)",local_80,local_50
            );
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_80);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x539,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_50,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_80[0] = 0.0;
  local_50[0] = (double)libcellml::Units::scalingFactor((shared_ptr *)&u2,(shared_ptr *)&u1,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"0.0","libcellml::Units::scalingFactor(u2, u1)",local_80,local_50
            );
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_80);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x53a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_50,(Message *)local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, checkingOwningModelBothUnits)
{
    libcellml::ModelPtr model = libcellml::Model::create();

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit("u", "milli", 2.0, 1000.0); // m^2
    u1->addUnit("dimensionless");

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit("u", "kilo", 2.0, 0.001); // standard, exponent.
    u2->addUnit("dimensionless");

    model->addUnits(u1);
    model->addUnits(u2);

    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u1, u2));
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u2, u1));
}